

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

BayesianProbitRegressor * __thiscall
CoreML::Specification::Model::mutable_bayesianprobitregressor(Model *this)

{
  BayesianProbitRegressor *this_00;
  
  if (this->_oneof_case_[0] == 0x130) {
    this_00 = (BayesianProbitRegressor *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x130;
    this_00 = (BayesianProbitRegressor *)operator_new(0x78);
    BayesianProbitRegressor::BayesianProbitRegressor(this_00);
    (this->Type_).bayesianprobitregressor_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::BayesianProbitRegressor* Model::mutable_bayesianprobitregressor() {
  if (!has_bayesianprobitregressor()) {
    clear_Type();
    set_has_bayesianprobitregressor();
    Type_.bayesianprobitregressor_ = new ::CoreML::Specification::BayesianProbitRegressor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.bayesianProbitRegressor)
  return Type_.bayesianprobitregressor_;
}